

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tftp.c
# Opt level: O3

CURLcode tftp_done(Curl_easy *data,CURLcode status,_Bool premature)

{
  tftp_state_data *ptVar1;
  int iVar2;
  CURLcode CVar3;
  
  ptVar1 = (data->conn->proto).tftpc;
  iVar2 = Curl_pgrsDone(data);
  CVar3 = CURLE_ABORTED_BY_CALLBACK;
  if (iVar2 == 0) {
    if (ptVar1 != (tftp_state_data *)0x0) {
      CVar3 = tftp_translate_code(ptVar1->error);
      return CVar3;
    }
    CVar3 = CURLE_OK;
  }
  return CVar3;
}

Assistant:

static CURLcode tftp_done(struct Curl_easy *data, CURLcode status,
                          bool premature)
{
  CURLcode result = CURLE_OK;
  struct connectdata *conn = data->conn;
  struct tftp_state_data *state = conn->proto.tftpc;

  (void)status; /* unused */
  (void)premature; /* not used */

  if(Curl_pgrsDone(data))
    return CURLE_ABORTED_BY_CALLBACK;

  /* If we have encountered an error */
  if(state)
    result = tftp_translate_code(state->error);

  return result;
}